

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetCalculateFeeFundRawTx(void *handle,void *fund_handle,int64_t *fee_amount)

{
  undefined8 uVar1;
  undefined8 *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiFundRawTxData *buffer;
  int result;
  string *in_stack_fffffffffffffee0;
  string *message;
  undefined8 in_stack_fffffffffffffee8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffef0;
  CfdException *this;
  undefined1 local_e1 [33];
  CfdSourceLocation local_c0;
  undefined1 local_9a;
  undefined1 local_99 [33];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [48];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  uVar2 = 0xffffffff;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"FundRawTxData",&local_59);
  cfd::capi::CheckBuffer(in_RDX,(string *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (in_RDX == (undefined8 *)0x0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0xd46;
    local_78.funcname = "CfdGetCalculateFeeFundRawTx";
    cfd::core::logger::warn<>(&local_78,"fee_amount is null.");
    local_9a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),"Failed to parameter. fee_amount is null.",(allocator *)this
              );
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffee0);
    local_9a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(in_RSI + 0x50) == 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0xd4f;
    local_c0.funcname = "CfdGetCalculateFeeFundRawTx";
    cfd::core::logger::warn<>(&local_c0,"target addresses is maximum over.");
    uVar1 = __cxa_allocate_exception(0x30);
    message = (string *)local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e1 + 1),"Failed to parameter. target addresses is maximum over.",
               (allocator *)message);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffffef0,error_code,message);
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  *in_RDX = *(undefined8 *)(in_RSI + 0x60);
  return 0;
}

Assistant:

int CfdGetCalculateFeeFundRawTx(
    void* handle, void* fund_handle, int64_t* fee_amount) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (fee_amount == nullptr) {
      warn(CFD_LOG_SOURCE, "fee_amount is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee_amount is null.");
    }

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if (buffer->append_txout_addresses == nullptr) {
      warn(CFD_LOG_SOURCE, "target addresses is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target addresses is maximum over.");
    }

    *fee_amount = buffer->calculate_fee;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}